

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sVertexArrayTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Stress::anon_unknown_1::SingleVertexArrayFirstTests::init
          (SingleVertexArrayFirstTests *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  TestContext *testCtx;
  GLValue min_;
  GLValue max_;
  int iVar1;
  int iVar2;
  MultiVertexArrayTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc;
  InputType type_00;
  GLValue GVar3;
  GLValue GVar4;
  bool local_2a5;
  int local_2a4;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  string name;
  undefined1 local_e8 [8];
  Spec spec;
  undefined4 uStack_ac;
  undefined1 local_a0 [8];
  ArraySpec arraySpec;
  int iStack_54;
  bool aligned;
  int stride;
  int firstNdx;
  int strideNdx;
  int countNdx;
  int offsetNdx;
  int inputTypeNdx;
  int strides [3];
  int offsets [2];
  int firsts [2];
  int counts [2];
  InputType inputTypes [3];
  SingleVertexArrayFirstTests *this_local;
  
  counts[0] = 0;
  counts[1] = 3;
  firsts[0] = 5;
  firsts[1] = 0x100;
  offsets[0] = 6;
  offsets[1] = 0x18;
  strides[1] = 1;
  strides[2] = 0x11;
  _offsetNdx = 0x11ffffffff;
  iVar1 = 0x20;
  strides[0] = 0x20;
  countNdx = 0;
  while (countNdx < 3) {
    for (strideNdx = 0; strideNdx < 2; strideNdx = strideNdx + 1) {
      for (firstNdx = 0; firstNdx < 2; firstNdx = firstNdx + 1) {
        for (stride = 0; stride < 3; stride = stride + 1) {
          for (iStack_54 = 0; iStack_54 < 2; iStack_54 = iStack_54 + 1) {
            if ((&offsetNdx)[stride] < 0) {
              local_2a4 = deqp::gls::Array::inputTypeSize(counts[countNdx]);
              local_2a4 = local_2a4 << 1;
            }
            else {
              local_2a4 = (&offsetNdx)[stride];
            }
            iVar1 = deqp::gls::Array::inputTypeSize(counts[countNdx]);
            local_2a5 = false;
            if (local_2a4 % iVar1 == 0) {
              iVar1 = strides[(long)strideNdx + 1];
              iVar2 = deqp::gls::Array::inputTypeSize(counts[countNdx]);
              local_2a5 = iVar1 % iVar2 == 0;
            }
            arraySpec.max.field_1._7_1_ = local_2a5;
            type = counts[countNdx];
            iVar1 = strides[(long)strideNdx + 1];
            GVar3 = deqp::gls::GLValue::getMinValue(type);
            GVar4 = deqp::gls::GLValue::getMaxValue(counts[countNdx]);
            spec.arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = GVar4.type;
            max_._4_4_ = spec.arrays.
                         super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            max_.type = (InputType)
                        spec.arrays.
                        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            min_._4_4_ = uStack_ac;
            min_.type = GVar3.type;
            min_.field_1 = GVar3.field_1;
            max_.field_1 = GVar4.field_1;
            deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                      ((ArraySpec *)local_a0,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,
                       2,iVar1,local_2a4,false,min_,max_);
            deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_e8);
            local_e8._0_4_ = PRIMITIVE_TRIANGLES;
            local_e8._4_4_ = firsts[firstNdx];
            spec.primitive = offsets[iStack_54];
            std::
            vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                         *)&spec.first,(ArraySpec *)local_a0);
            deqp::gls::Array::inputTypeToString_abi_cxx11_
                      (&local_218,(Array *)(ulong)(uint)counts[countNdx],type_00);
            std::operator+(&local_1f8,&local_218,"_first");
            typeToString<int>(&local_238,offsets[iStack_54]);
            std::operator+(&local_1d8,&local_1f8,&local_238);
            std::operator+(&local_1b8,&local_1d8,"_offset");
            typeToString<int>(&local_258,strides[(long)strideNdx + 1]);
            std::operator+(&local_198,&local_1b8,&local_258);
            std::operator+(&local_178,&local_198,"_stride");
            typeToString<int>(&local_278,local_2a4);
            std::operator+(&local_158,&local_178,&local_278);
            std::operator+(&local_138,&local_158,"_quads");
            typeToString<int>(&local_298,firsts[firstNdx]);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_118,&local_138,&local_298);
            std::__cxx11::string::~string((string *)&local_298);
            std::__cxx11::string::~string((string *)&local_138);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&local_198);
            std::__cxx11::string::~string((string *)&local_258);
            std::__cxx11::string::~string((string *)&local_1b8);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::__cxx11::string::~string((string *)&local_238);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::string::~string((string *)&local_218);
            if ((arraySpec.max.field_1._7_1_ & 1) == 0) {
              this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
              testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
              renderCtx = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
              name_00 = (char *)std::__cxx11::string::c_str();
              desc = (char *)std::__cxx11::string::c_str();
              deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                        (this_00,testCtx,renderCtx,(Spec *)local_e8,name_00,desc);
              tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
            }
            std::__cxx11::string::~string((string *)local_118);
            deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_e8);
          }
        }
      }
    }
    iVar1 = countNdx + 1;
    countNdx = iVar1;
  }
  return iVar1;
}

Assistant:

void SingleVertexArrayFirstTests::init (void)
{
	// Test strides with different input types, component counts and storage, Usage(?)
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_FIXED};
	int					counts[]		= {5, 256};
	int					firsts[]		= {6, 24};
	int					offsets[]		= {1, 17};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
		{
			for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
			{
				for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
				{
					for (int firstNdx = 0; firstNdx < DE_LENGTH_OF_ARRAY(firsts); firstNdx++)
					{
						const int	stride	= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * 2 : strides[strideNdx]);
						const bool	aligned	= ((stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0) && (offsets[offsetNdx] % Array::inputTypeSize(inputTypes[inputTypeNdx]) == 0);

						MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																		Array::OUTPUTTYPE_VEC2,
																		Array::STORAGE_BUFFER,
																		Array::USAGE_DYNAMIC_DRAW,
																		2,
																		offsets[offsetNdx],
																		stride,
																		false,
																		GLValue::getMinValue(inputTypes[inputTypeNdx]),
																		GLValue::getMaxValue(inputTypes[inputTypeNdx]));

						MultiVertexArrayTest::Spec spec;
						spec.primitive	= Array::PRIMITIVE_TRIANGLES;
						spec.drawCount	= counts[countNdx];
						spec.first		= firsts[firstNdx];
						spec.arrays.push_back(arraySpec);

						std::string name = Array::inputTypeToString(inputTypes[inputTypeNdx]) + "_first" + typeToString(firsts[firstNdx]) + "_offset" + typeToString(offsets[offsetNdx]) + "_stride" + typeToString(stride) + "_quads" + typeToString(counts[countNdx]);
						if (!aligned)
							addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
					}
				}
			}
		}
	}
}